

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::flipinsertfacet
          (tetgenmesh *this,arraypool *crosstets,arraypool *toppoints,arraypool *botpoints,
          arraypool *midpoints)

{
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  arraypool *paVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  badface *pbVar8;
  memorypool *pmVar9;
  tetrahedron ppdVar10;
  double *pdVar11;
  ulong uVar12;
  undefined8 uVar13;
  bool bVar14;
  point pdVar15;
  point pdVar16;
  arraypool *paVar17;
  uint uVar18;
  char *pcVar19;
  arraypool *this_00;
  ulong uVar20;
  undefined4 *puVar21;
  long lVar22;
  uint *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  tetrahedron *pppdVar29;
  uint uVar30;
  tetrahedron ppdVar31;
  bool bVar32;
  double dVar33;
  badface *pqueue;
  triface fliptets [6];
  point plane_pc;
  point plane_pb;
  point plane_pa;
  flipconstraints fc;
  double ori [3];
  badface *local_1d8;
  tetrahedron *local_1d0;
  int local_1c4;
  arraypool *local_1c0;
  tetrahedron local_1b8;
  double *local_1b0;
  tetrahedron local_1a8;
  undefined8 uStack_1a0;
  triface local_198;
  tetrahedron local_188;
  uint local_180 [2];
  tetrahedron local_178;
  undefined4 local_170;
  tetrahedron local_168;
  undefined4 local_160;
  ulong local_130;
  double *local_128;
  point local_120;
  point local_118;
  point local_110;
  double local_108;
  long local_100;
  tetrahedron local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  arraypool *local_d8;
  arraypool *local_d0;
  flipconstraints local_c8;
  double adStack_48 [3];
  
  lVar22 = 8;
  do {
    *(undefined8 *)((long)&uStack_1a0 + lVar22) = 0;
    *(undefined4 *)((long)&local_198.tet + lVar22) = 0;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x68);
  local_c8.seg[0] = (point)0x0;
  local_c8.fac[0] = (point)0x0;
  local_c8.remvert = (point)0x0;
  local_c8.enqflag = 0;
  local_c8.chkencflag = 0;
  local_c8.unflip = 0;
  local_c8.collectnewtets = 0;
  local_c8.collectencsegflag = 0;
  local_c8.remove_ndelaunay_edge = 0;
  local_c8.bak_tetprism_vol._0_4_ = 0;
  local_c8.bak_tetprism_vol._4_4_ = 0;
  local_c8.tetprism_vol_sum._0_4_ = 0;
  local_c8._36_8_ = 0;
  local_c8.cosdihed_in = 0.0;
  local_c8.cosdihed_out = 0.0;
  local_c8.checkflipeligibility = 0;
  local_f0 = this->flip23count;
  local_e8 = this->flip32count;
  local_e0 = this->flip44count;
  calculateabovepoint(this,midpoints,&local_110,&local_118,&local_120);
  lVar22 = toppoints->objects;
  if (0 < lVar22) {
    ppcVar3 = toppoints->toparray;
    lVar26 = 0;
    do {
      uVar18 = *(uint *)(*(long *)(ppcVar3[(uint)lVar26 >>
                                           ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                  (long)toppoints->objectbytes *
                                  (long)(int)(toppoints->objectsperblockmark & (uint)lVar26)) + 4 +
                        (long)this->pointmarkindex * 4);
      if ((uVar18 & 2) == 0) {
        *(uint *)(*(long *)(ppcVar3[(uint)lVar26 >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                           (long)toppoints->objectbytes *
                           (long)(int)(toppoints->objectsperblockmark & (uint)lVar26)) + 4 +
                 (long)this->pointmarkindex * 4) = uVar18 | 4;
      }
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
  }
  lVar22 = botpoints->objects;
  if (0 < lVar22) {
    ppcVar3 = botpoints->toparray;
    lVar26 = 0;
    do {
      uVar18 = *(uint *)(*(long *)(ppcVar3[(uint)lVar26 >>
                                           ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                  (long)botpoints->objectbytes *
                                  (long)(int)(botpoints->objectsperblockmark & (uint)lVar26)) + 4 +
                        (long)this->pointmarkindex * 4);
      if ((uVar18 & 2) == 0) {
        *(uint *)(*(long *)(ppcVar3[(uint)lVar26 >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                           (long)botpoints->objectbytes *
                           (long)(int)(botpoints->objectsperblockmark & (uint)lVar26)) + 4 +
                 (long)this->pointmarkindex * 4) = uVar18 | 8;
      }
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
  }
  paVar4 = this->cavetetlist;
  local_d8 = toppoints;
  local_d0 = botpoints;
  if (0 < crosstets->objects) {
    lVar22 = 0;
    do {
      lVar26 = *(long *)(crosstets->toparray
                         [(uint)lVar22 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                        (long)crosstets->objectbytes *
                        (long)(int)(crosstets->objectsperblockmark & (uint)lVar22));
      lVar25 = 0;
      do {
        if ((*(uint *)((*(ulong *)(lVar26 + lVar25 * 8) & 0xfffffffffffffff0) +
                      (long)this->elemmarkerindex * 4) & 3) == 1) {
          pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
          lVar27 = (long)paVar4->objectbytes *
                   ((long)paVar4->objectsperblock - 1U & paVar4->objects);
          paVar4->objects = paVar4->objects + 1;
          *(long *)(pcVar19 + lVar27) = lVar26;
          *(int *)(pcVar19 + lVar27 + 8) = (int)lVar25;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      puVar23 = (uint *)(lVar26 + (long)this->elemmarkerindex * 4);
      *puVar23 = *puVar23 | 2;
      lVar22 = lVar22 + 1;
    } while (lVar22 < crosstets->objects);
  }
  if (1 < this->b->verbose) {
    printf("    Found %ld crossing faces.\n");
  }
  pdVar16 = local_118;
  pdVar15 = local_120;
  lVar22 = crosstets->objects;
  if (0 < lVar22) {
    ppcVar3 = crosstets->toparray;
    lVar26 = 0;
    do {
      lVar25 = *(long *)(ppcVar3[(uint)lVar26 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                        (long)crosstets->objectbytes *
                        (long)(int)(crosstets->objectsperblockmark & (uint)lVar26));
      puVar23 = (uint *)(lVar25 + (long)this->elemmarkerindex * 4);
      *puVar23 = *puVar23 & 0xfffffffd;
      puVar23 = (uint *)(lVar25 + (long)this->elemmarkerindex * 4);
      *puVar23 = *puVar23 & 0xfffffffe;
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
  }
  local_1d8 = (badface *)0x0;
  if (0 < paVar4->objects) {
    lVar22 = 0;
    do {
      flipcertify(this,(triface *)
                       (paVar4->toparray[(uint)lVar22 >> ((byte)paVar4->log2objectsperblock & 0x1f)]
                       + (long)paVar4->objectbytes *
                         (long)(int)(paVar4->objectsperblockmark & (uint)lVar22)),&local_1d8,
                  local_110,pdVar16,pdVar15);
      lVar22 = lVar22 + 1;
    } while (lVar22 < paVar4->objects);
  }
  paVar4->objects = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x10;
  this_00->objectsperblock = 0x10;
  this_00->log2objectsperblock = 4;
  this_00->objectsperblockmark = 0xf;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  local_130 = 0;
  this_00->totalmemory = 0;
  if (local_1d8 == (badface *)0x0) {
    bVar32 = true;
  }
  else {
    do {
      pppdVar29 = (local_1d8->tt).tet;
      uVar18 = (local_1d8->tt).ver;
      dVar33 = local_1d8->key;
      ppdVar5 = (tetrahedron)local_1d8->forg;
      ppdVar6 = (tetrahedron)local_1d8->fdest;
      ppdVar7 = (tetrahedron)local_1d8->fapex;
      local_1a8 = (tetrahedron)local_1d8->foppo;
      local_1b0 = local_1d8->noppo;
      pbVar8 = local_1d8->nextitem;
      pmVar9 = this->flippool;
      (local_1d8->tt).tet = (tetrahedron *)pmVar9->deaditemstack;
      pmVar9->deaditemstack = local_1d8;
      pmVar9->items = pmVar9->items + -1;
      local_1d8 = pbVar8;
      if (((((pppdVar29 != (tetrahedron *)0x0) && (pppdVar29[4] != (tetrahedron)0x0)) &&
           (pppdVar29[orgpivot[(int)uVar18]] == ppdVar5)) &&
          ((pppdVar29[destpivot[(int)uVar18]] == ppdVar6 &&
           (pppdVar29[apexpivot[(int)uVar18]] == ppdVar7)))) &&
         (ppdVar10 = pppdVar29[oppopivot[(int)uVar18]], ppdVar10 == local_1a8)) {
        ppdVar31 = (tetrahedron)((ulong)pppdVar29[uVar18 & 3] & 0xfffffffffffffff0);
        lVar22 = (long)fsymtbl[(int)uVar18][(uint)pppdVar29[uVar18 & 3] & 0xf];
        pdVar11 = ppdVar31[oppopivot[lVar22]];
        if (pdVar11 == local_1b0) {
          local_1d0 = pppdVar29;
          local_1c0 = this_00;
          local_128 = pdVar11;
          local_108 = dVar33;
          local_100 = lVar22;
          local_f8 = ppdVar31;
          if (2 < this->b->verbose) {
            lVar22 = (long)this->pointmarkindex;
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",dVar33,
                   (ulong)*(uint *)((long)ppdVar5 + lVar22 * 4),
                   (ulong)*(uint *)((long)ppdVar6 + lVar22 * 4),
                   (ulong)*(uint *)((long)ppdVar7 + lVar22 * 4),
                   (ulong)*(uint *)((long)local_1a8 + lVar22 * 4),
                   (ulong)*(uint *)((long)local_1b0 + lVar22 * 4));
          }
          lVar22 = 0;
          local_1c4 = 3;
          uStack_1a0._4_4_ = 0;
          local_1b8 = ppdVar10;
          do {
            dVar33 = orient3d((double *)local_1d0[orgpivot[(int)uVar18]],
                              (double *)local_1d0[destpivot[(int)uVar18]],(double *)local_1b8,
                              local_128);
            this_00 = local_1c0;
            adStack_48[lVar22] = dVar33;
            if (0.0 <= dVar33) {
              if ((dVar33 == 0.0) && (!NAN(dVar33))) {
                local_1c4 = local_1c4 + -1;
                uStack_1a0._4_4_ = uStack_1a0._4_4_ + 1;
              }
            }
            else {
              local_1c4 = local_1c4 + -1;
            }
            uVar18 = enexttbl[(int)uVar18];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          if (local_1c4 == 3) {
            local_198.tet = local_1d0;
            local_188 = local_f8;
            local_180[0] = (uint)local_100;
            local_198.ver = uVar18;
            flip23(this,&local_198,1,&local_c8);
            lVar22 = 8;
            do {
              uVar13 = *(undefined8 *)((long)&uStack_1a0 + lVar22);
              iVar24 = eprevesymtbl[*(int *)((long)&local_198.tet + lVar22)];
              pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
              lVar26 = (long)paVar4->objectbytes *
                       ((long)paVar4->objectsperblock - 1U & paVar4->objects);
              paVar4->objects = paVar4->objects + 1;
              *(undefined8 *)(pcVar19 + lVar26) = uVar13;
              *(int *)(pcVar19 + lVar26 + 8) = iVar24;
              lVar22 = lVar22 + 0x10;
            } while (lVar22 != 0x38);
            lVar22 = 8;
            do {
              uVar13 = *(undefined8 *)((long)&uStack_1a0 + lVar22);
              iVar24 = enextesymtbl[*(int *)((long)&local_198.tet + lVar22)];
              pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
              lVar26 = (long)paVar4->objectbytes *
                       ((long)paVar4->objectsperblock - 1U & paVar4->objects);
              paVar4->objects = paVar4->objects + 1;
              *(undefined8 *)(pcVar19 + lVar26) = uVar13;
              *(int *)(pcVar19 + lVar26 + 8) = iVar24;
              lVar22 = lVar22 + 0x10;
            } while (lVar22 != 0x38);
LAB_00138f17:
            bVar32 = false;
            bVar14 = true;
            this_00 = local_1c0;
          }
          else {
            if (local_1c4 == 2) {
              lVar22 = 0;
              do {
                if (adStack_48[lVar22] <= 0.0) break;
                uVar18 = enexttbl[(int)uVar18];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              local_198.tet = local_1d0;
              local_198.ver = esymtbl[(int)uVar18];
              iVar24 = this->pointmarkindex;
              puVar23 = local_180;
              uVar28 = 0;
              while( true ) {
                uVar1 = puVar23[-4];
                if ((*(byte *)(*(long *)(*(long *)(puVar23 + -6) + (long)apexpivot[(int)uVar1] * 8)
                               + 4 + (long)iVar24 * 4) & 0xe) == 0) break;
                uVar20 = uVar28 + 1;
                uVar12 = *(ulong *)(*(long *)(puVar23 + -6) + (long)facepivot1[(int)uVar1] * 8);
                uVar30 = (uint)uVar12 & 0xf;
                *puVar23 = uVar30;
                pppdVar29 = (tetrahedron *)(uVar12 & 0xfffffffffffffff0);
                *(tetrahedron **)(puVar23 + -2) = pppdVar29;
                *puVar23 = facepivot2[(int)uVar1][uVar30];
                if ((3 < uVar28) || (puVar23 = puVar23 + 4, uVar28 = uVar20, local_1d0 == pppdVar29)
                   ) goto LAB_00138e27;
              }
              uVar20 = 1000;
LAB_00138e27:
              if ((int)uVar20 == 3) {
                flip32(this,&local_198,1,&local_c8);
                iVar24 = 3;
                do {
                  pppdVar29 = local_198.tet;
                  iVar2 = esymtbl[local_198.ver];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar22 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(tetrahedron **)(pcVar19 + lVar22) = pppdVar29;
                  *(int *)(pcVar19 + lVar22 + 8) = iVar2;
                  local_198.ver = enexttbl[local_198.ver];
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
                iVar24 = 3;
                do {
                  ppdVar5 = local_188;
                  iVar2 = esymtbl[(int)local_180[0]];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar22 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(tetrahedron *)(pcVar19 + lVar22) = ppdVar5;
                  *(int *)(pcVar19 + lVar22 + 8) = iVar2;
                  local_180[0] = enexttbl[(int)local_180[0]];
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
              }
              else {
                if (uStack_1a0._4_4_ != 1 || (int)uVar20 != 4) {
                  bVar32 = true;
                  goto LAB_001391a7;
                }
                local_1a8 = local_178;
                local_1b0 = (double *)CONCAT44(local_1b0._4_4_,local_170);
                local_1b8 = local_168;
                local_128 = (double *)CONCAT44(local_128._4_4_,local_160);
                local_198.ver = uVar18;
                flip23(this,&local_198,1,&local_c8);
                lVar22 = 0x18;
                do {
                  uVar13 = *(undefined8 *)((long)&uStack_1a0 + lVar22);
                  iVar24 = eprevesymtbl[*(int *)((long)&local_198.tet + lVar22)];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar26 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(undefined8 *)(pcVar19 + lVar26) = uVar13;
                  *(int *)(pcVar19 + lVar26 + 8) = iVar24;
                  lVar22 = lVar22 + 0x10;
                } while (lVar22 != 0x38);
                lVar22 = 0x18;
                do {
                  uVar13 = *(undefined8 *)((long)&uStack_1a0 + lVar22);
                  iVar24 = enextesymtbl[*(int *)((long)&local_198.tet + lVar22)];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar26 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(undefined8 *)(pcVar19 + lVar26) = uVar13;
                  *(int *)(pcVar19 + lVar26 + 8) = iVar24;
                  lVar22 = lVar22 + 0x10;
                } while (lVar22 != 0x38);
                local_198.ver = eprevtbl[enextesymtbl[local_198.ver]];
                local_188 = local_1a8;
                local_180[0] = (uint)local_1b0;
                local_178 = local_1b8;
                local_170 = local_128._0_4_;
                flip32(this,&local_198,1,&local_c8);
                local_198.ver = enexttbl[local_198.ver];
                iVar24 = 2;
                do {
                  pppdVar29 = local_198.tet;
                  iVar2 = esymtbl[local_198.ver];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar22 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(tetrahedron **)(pcVar19 + lVar22) = pppdVar29;
                  *(int *)(pcVar19 + lVar22 + 8) = iVar2;
                  local_198.ver = enexttbl[local_198.ver];
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
                local_180[0] = enexttbl[(int)local_180[0]];
                iVar24 = 2;
                do {
                  ppdVar5 = local_188;
                  iVar2 = esymtbl[(int)local_180[0]];
                  pcVar19 = arraypool::getblock(paVar4,(int)paVar4->objects);
                  lVar22 = (long)paVar4->objectbytes *
                           ((long)paVar4->objectsperblock - 1U & paVar4->objects);
                  paVar4->objects = paVar4->objects + 1;
                  *(tetrahedron *)(pcVar19 + lVar22) = ppdVar5;
                  *(int *)(pcVar19 + lVar22 + 8) = iVar2;
                  local_180[0] = enexttbl[(int)local_180[0]];
                  iVar24 = iVar24 + -1;
                } while (iVar24 != 0);
                this->flip23count = this->flip23count + -1;
                this->flip32count = this->flip32count + -1;
                this->flip44count = this->flip44count + 1;
              }
              goto LAB_00138f17;
            }
            if (2 < this->b->verbose) {
              lVar22 = (long)this->pointmarkindex;
              printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",local_108,
                     (ulong)*(uint *)((long)ppdVar5 + lVar22 * 4),
                     (ulong)*(uint *)((long)ppdVar6 + lVar22 * 4),
                     (ulong)*(uint *)((long)ppdVar7 + lVar22 * 4),
                     (ulong)*(uint *)((long)local_1a8 + lVar22 * 4),
                     (ulong)*(uint *)((long)local_1b0 + lVar22 * 4));
            }
            bVar32 = false;
LAB_001391a7:
            bVar14 = false;
          }
          pdVar16 = local_118;
          pdVar15 = local_120;
          pppdVar29 = local_1d0;
          if (bVar14) {
            if (0 < paVar4->objects) {
              lVar22 = 0;
              do {
                flipcertify(this,(triface *)
                                 (paVar4->toparray
                                  [(uint)lVar22 >> ((byte)paVar4->log2objectsperblock & 0x1f)] +
                                 (long)paVar4->objectbytes *
                                 (long)(int)(paVar4->objectsperblockmark & (uint)lVar22)),&local_1d8
                            ,local_110,pdVar16,pdVar15);
                lVar22 = lVar22 + 1;
              } while (lVar22 < paVar4->objects);
            }
            pdVar16 = local_118;
            pdVar15 = local_120;
            paVar4->objects = 0;
            if (0 < this_00->objects) {
              lVar22 = 0;
              do {
                lVar25 = (long)this_00->objectbytes *
                         (long)(int)(this_00->objectsperblockmark & (uint)lVar22);
                lVar26 = *(long *)(this_00->toparray
                                   [(uint)lVar22 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                                  lVar25);
                if ((lVar26 != 0) && (*(long *)(lVar26 + 0x20) != 0)) {
                  flipcertify(this,(triface *)
                                   (this_00->toparray
                                    [(uint)lVar22 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                                   lVar25),&local_1d8,local_110,pdVar16,pdVar15);
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < this_00->objects);
            }
            this_00->objects = 0;
            local_130 = (ulong)((int)local_130 + 1);
          }
          else if (bVar32) {
            pcVar19 = arraypool::getblock(this_00,(int)this_00->objects);
            lVar22 = (long)this_00->objectbytes *
                     ((long)this_00->objectsperblock - 1U & this_00->objects);
            this_00->objects = this_00->objects + 1;
            *(tetrahedron **)(pcVar19 + lVar22) = pppdVar29;
            *(uint *)(pcVar19 + lVar22 + 8) = uVar18;
          }
        }
      }
    } while (local_1d8 != (badface *)0x0);
    bVar32 = (int)local_130 == 0;
  }
  paVar17 = local_d0;
  paVar4 = local_d8;
  if ((bool)(0 < this_00->objects & bVar32)) {
    printf("!! No flip is found in %ld faces.\n");
    puVar21 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar21 = 2;
    __cxa_throw(puVar21,&int::typeinfo,0);
  }
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  lVar22 = paVar4->objects;
  if (0 < lVar22) {
    ppcVar3 = paVar4->toparray;
    lVar26 = 0;
    do {
      puVar23 = (uint *)(*(long *)(ppcVar3[(uint)lVar26 >>
                                           ((byte)paVar4->log2objectsperblock & 0x1f)] +
                                  (long)paVar4->objectbytes *
                                  (long)(int)(paVar4->objectsperblockmark & (uint)lVar26)) + 4 +
                        (long)this->pointmarkindex * 4);
      *puVar23 = *puVar23 & 0xfffffffb;
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
  }
  lVar22 = paVar17->objects;
  if (0 < lVar22) {
    ppcVar3 = paVar17->toparray;
    lVar26 = 0;
    do {
      puVar23 = (uint *)(*(long *)(ppcVar3[(uint)lVar26 >>
                                           ((byte)paVar17->log2objectsperblock & 0x1f)] +
                                  (long)paVar17->objectbytes *
                                  (long)(int)(paVar17->objectsperblockmark & (uint)lVar26)) + 4 +
                        (long)this->pointmarkindex * 4);
      *puVar23 = *puVar23 & 0xfffffff7;
      lVar26 = lVar26 + 1;
    } while (lVar22 != lVar26);
  }
  if (2 < this->b->verbose) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           (this->flip32count - local_e8) + (this->flip23count - local_f0) +
           (this->flip44count - local_e0));
  }
  return;
}

Assistant:

void tetgenmesh::flipinsertfacet(arraypool *crosstets, arraypool *toppoints,
                                 arraypool *botpoints, arraypool *midpoints)
{
  arraypool *crossfaces, *bfacearray;
  triface fliptets[6], baktets[2], fliptet, newface;
  triface neightet, *parytet;
  badface *pqueue;
  badface *popbf, bface;
  point plane_pa, plane_pb, plane_pc;
  point p1, p2, pd, pe;
  point *parypt;
  flipconstraints fc;
  REAL ori[3];
  int convcount, copcount;
  int flipflag, fcount;
  int n, i;
  long f23count, f32count, f44count;
  long totalfcount;

  f23count = flip23count;
  f32count = flip32count;
  f44count = flip44count;

  // Get three affinely independent vertices in the missing region R.
  calculateabovepoint(midpoints, &plane_pa, &plane_pb, &plane_pc);

  // Mark top and bottom points. Do not mark midpoints.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest2(*parypt);
    }
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest3(*parypt);
    }
  }

  // Collect crossing faces. 
  crossfaces = cavetetlist;  // Re-use array 'cavetetlist'.

  // Each crossing face contains at least one bottom vertex and
  //   one top vertex.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    fliptet = *parytet;
    for (fliptet.ver = 0; fliptet.ver < 4; fliptet.ver++) {
      fsym(fliptet, neightet);
      if (infected(neightet)) { // It is an interior face.
        if (!marktested(neightet)) { // It is an unprocessed face.
          crossfaces->newindex((void **) &parytet);
          *parytet = fliptet;
        }
      }
    }
    marktest(fliptet);
  }

  if (b->verbose > 1) {
    printf("    Found %ld crossing faces.\n", crossfaces->objects);
  }

  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    unmarktest(*parytet);
    uninfect(*parytet);
  }

  // Initialize the priority queue.
  pqueue = NULL;

  for (i = 0; i < crossfaces->objects; i++) {
    parytet = (triface *) fastlookup(crossfaces, i);
    flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
  }
  crossfaces->restart();

  // The list for temporarily storing unflipable faces.
  bfacearray = new arraypool(sizeof(triface), 4);


  fcount = 0;  // Count the number of flips.

  // Flip insert the facet.
  while (pqueue != NULL) {

    // Pop a face from the priority queue.
    popbf = pqueue;
    bface = *popbf;
    // Update the queue.
    pqueue = pqueue->nextitem;
    // Delete the popped item from the pool.
    flippool->dealloc((void *) popbf);

    if (!isdeadtet(bface.tt)) {
      if ((org(bface.tt) == bface.forg) && (dest(bface.tt) == bface.fdest) &&
          (apex(bface.tt) == bface.fapex) && (oppo(bface.tt) == bface.foppo)) {
        // It is still a crossing face of R.
        fliptet = bface.tt;
        fsym(fliptet, neightet);
        if (oppo(neightet) == bface.noppo) {
          pd = oppo(fliptet);
          pe = oppo(neightet);

          if (b->verbose > 2) {
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                   pointmark(bface.forg), pointmark(bface.fdest),
                   pointmark(bface.fapex), pointmark(bface.foppo),
                   pointmark(bface.noppo), bface.key);
          }
          flipflag = 0;

          // Check for which type of flip can we do.
          convcount = 3;
          copcount = 0;
          for (i = 0; i < 3; i++) {
            p1 = org(fliptet);
            p2 = dest(fliptet);
            ori[i] = orient3d(p1, p2, pd, pe);
            if (ori[i] < 0) {
              convcount--;
              //break;
            } else if (ori[i] == 0) {
              convcount--; // Possible 4-to-4 flip.
              copcount++;
              //break;
            }
            enextself(fliptet);
          }

          if (convcount == 3) {
            // A 2-to-3 flip is found.
            fliptets[0] = fliptet; // abcd, d may be the new vertex.
            fliptets[1] = neightet; // bace.
            flip23(fliptets, 1, &fc);
            // Put the link faces into check list.
            for (i = 0; i < 3; i++) {
              eprevesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            for (i = 0; i < 3; i++) {
              enextesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            flipflag = 1;
          } else if (convcount == 2) {
            //if (copcount <= 1) {
            // A 3-to-2 or 4-to-4 may be possible.
            // Get the edge which is locally non-convex or flat. 
            for (i = 0; i < 3; i++) {
              if (ori[i] <= 0) break;
              enextself(fliptet);
            }

            // Collect tets sharing at this edge.
            esym(fliptet, fliptets[0]); // [b,a,d,c]
            n = 0;
            do {
              p1 = apex(fliptets[n]);
              if (!(pmarktested(p1) || pmarktest2ed(p1) || pmarktest3ed(p1))) {
                // This apex is not on the cavity. Hence the face does not
                //   lie inside the cavity. Do not flip this edge.
                n = 1000; break;
              }
              fnext(fliptets[n], fliptets[n + 1]);
              n++;
            } while ((fliptets[n].tet != fliptet.tet) && (n < 5));

            if (n == 3) {
              // Found a 3-to-2 flip.
              flip32(fliptets, 1, &fc);
              // Put the link faces into check list.
              for (i = 0; i < 3; i++) {
                esym(fliptets[0], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[0]);
              }
              for (i = 0; i < 3; i++) {
                esym(fliptets[1], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[1]);
              }
              flipflag = 1;
            } else if (n == 4) {
              if (copcount == 1) {                
                // Found a 4-to-4 flip. 
                // Let the six vertices are: a,b,c,d,e,f, where
                //   fliptets[0] = [b,a,d,c]
                //           [1] = [b,a,c,e]
                //           [2] = [b,a,e,f]
                //           [3] = [b,a,f,d]
                // After the 4-to-4 flip, edge [a,b] is flipped, edge [e,d]
                //   is created.
                // First do a 2-to-3 flip.
                // Comment: This flip temporarily creates a degenerated
                //   tet (whose volume is zero). It will be removed by the 
                //   followed 3-to-2 flip.
                fliptets[0] = fliptet; // = [a,b,c,d], d is the new vertex.
                // fliptets[1];        // = [b,a,c,e].
                baktets[0] = fliptets[2]; // = [b,a,e,f]
                baktets[1] = fliptets[3]; // = [b,a,f,d]
                // The flip may involve hull tets.
                flip23(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [e,d,a,b] => will be flipped, so 
                //   [a,b,d] and [a,b,e] are not "outer" link faces.
                for (i = 1; i < 3; i++) {
                  eprevesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                for (i = 1; i < 3; i++) {
                  enextesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                // Then do a 3-to-2 flip.
                enextesymself(fliptets[0]);  // fliptets[0] is [e,d,a,b].
                eprevself(fliptets[0]); // = [b,a,d,c], d is the new vertex.
                fliptets[1] = baktets[0]; // = [b,a,e,f]
                fliptets[2] = baktets[1]; // = [b,a,f,d]
                flip32(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [d,e,f,a]
                //   fliptets[1] = [e,d,f,b]
                //   Faces [a,b,d] and [a,b,e] are not "outer" link faces.
                enextself(fliptets[0]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[0], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[0]);
                }
                enextself(fliptets[1]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[1], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[1]);
                }
                flip23count--;
                flip32count--;
                flip44count++;
                flipflag = 1;
              }
            }
          } else {
            // There are more than 1 non-convex or coplanar cases.
            flipflag = -1; // Ignore this face.
            if (b->verbose > 2) {
              printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                     pointmark(bface.forg), pointmark(bface.fdest),
                     pointmark(bface.fapex), pointmark(bface.foppo),
                     pointmark(bface.noppo), bface.key);
            }
          } // if (convcount == 1)

          if (flipflag == 1) {
            // Update the priority queue.
            for (i = 0; i < crossfaces->objects; i++) {
              parytet = (triface *) fastlookup(crossfaces, i);
              flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
            }
            crossfaces->restart();
            if (1) { // if (!b->flipinsert_random) {
              // Insert all queued unflipped faces.
              for (i = 0; i < bfacearray->objects; i++) {
                parytet = (triface *) fastlookup(bfacearray, i);
                // This face may be changed.
                if (!isdeadtet(*parytet)) {
                  flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
                }
              }
              bfacearray->restart();
            }
            fcount++;
          } else if (flipflag == 0) {
            // Queue an unflippable face. To process it later.
            bfacearray->newindex((void **) &parytet);
            *parytet = fliptet;
          }
        } // if (pe == bface.noppo)  
      } // if ((pa == bface.forg) && ...)
    } // if (bface.tt != NULL)

  } // while (pqueue != NULL)

  if (bfacearray->objects > 0) {
    if (fcount == 0) {
      printf("!! No flip is found in %ld faces.\n", bfacearray->objects);
      terminatetetgen(this, 2); //assert(0);
    }
  }

  delete bfacearray;

  // Un-mark top and bottom points.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    punmarktest2(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    punmarktest3(*parypt);
  }

  f23count = flip23count - f23count;
  f32count = flip32count - f32count;
  f44count = flip44count - f44count;
  totalfcount = f23count + f32count + f44count;
  if (b->verbose > 2) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           totalfcount, f23count, f32count, f44count);
  }
}